

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_heap.h
# Opt level: O0

void __thiscall csbpl_common::Heap<double>::clear(Heap<double> *this)

{
  bool bVar1;
  reference psVar2;
  element_type *peVar3;
  undefined1 local_38 [8];
  Ptr e;
  iterator __end0;
  iterator __begin0;
  vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  *__range2;
  Heap<double> *this_local;
  
  __end0 = std::
           vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
           ::begin(&this->data_);
  e.super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          std::
          vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
          ::end(&this->data_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::shared_ptr<csbpl_common::Heap<double>::Element>_*,_std::vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>_>
                                     *)&e.
                                        super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar1) {
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<csbpl_common::Heap<double>::Element>_*,_std::vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>_>
             ::operator*(&__end0);
    std::shared_ptr<csbpl_common::Heap<double>::Element>::shared_ptr
              ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_38,psVar2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      peVar3->heap_index_ = -1;
    }
    std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
              ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_38);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<csbpl_common::Heap<double>::Element>_*,_std::vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>_>
    ::operator++(&__end0);
  }
  std::
  vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ::clear(&this->data_);
  return;
}

Assistant:

void clear()
  {
    for (Ptr e : data_)
    {
      if (e)
        e->heap_index_ = -1;
    }

    data_.clear();
  }